

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O3

bool __thiscall
cmExportInstallFileGenerator::GenerateMainFile(cmExportInstallFileGenerator *this,ostream *os)

{
  _Base_ptr *pp_Var1;
  cmExportSet *pcVar2;
  pointer ppcVar3;
  cmTargetExport *tei;
  cmGeneratorTarget *this_00;
  pointer pbVar4;
  TargetType TVar5;
  bool bVar6;
  bool bVar7;
  TargetType TVar8;
  PolicyStatus PVar9;
  int iVar10;
  undefined8 *puVar11;
  char *pcVar12;
  ostream *poVar13;
  string *psVar14;
  cmTargetExport **ppcVar15;
  char *pcVar16;
  cmExportInstallFileGenerator *pcVar17;
  pointer ppcVar18;
  undefined8 uVar19;
  uint uVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  string *c;
  pointer pbVar22;
  pair<std::_Rb_tree_iterator<cmGeneratorTarget_*>,_bool> pVar23;
  string expectedTargets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missingTargets;
  string sep;
  cmTargetExport *te;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> allTargets;
  ostringstream e;
  string local_290;
  cmExportInstallFileGenerator *local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  ostream *local_228;
  cmTargetExport *local_220;
  cmTargetExport **local_218;
  iterator iStack_210;
  cmTargetExport **local_208;
  undefined8 local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  TargetType local_1e0;
  uint local_1dc;
  string local_1d8;
  cmTargetExport **local_1b8;
  cmTargetExport **local_1b0;
  undefined1 local_1a8 [16];
  _Base_ptr local_198;
  _Base_ptr p_Stack_190;
  _Base_ptr local_188;
  size_t local_180;
  ios_base local_138 [264];
  
  local_218 = (cmTargetExport **)0x0;
  iStack_210._M_current = (cmTargetExport **)0x0;
  local_208 = (cmTargetExport **)0x0;
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  local_290._M_string_length = 0;
  local_290.field_2._M_local_buf[0] = '\0';
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  local_248._M_string_length = 0;
  local_248.field_2._M_local_buf[0] = '\0';
  pcVar2 = this->IEGen->ExportSet;
  ppcVar18 = (pcVar2->TargetExports).
             super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppcVar3 = (pcVar2->TargetExports).
            super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_270 = this;
  local_228 = os;
  if (ppcVar18 != ppcVar3) {
    do {
      local_220 = *ppcVar18;
      std::operator+(&local_268,&local_248,&(this->super_cmExportFileGenerator).Namespace);
      cmGeneratorTarget::GetExportName_abi_cxx11_(&local_1d8,local_220->Target);
      uVar19 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        uVar19 = local_268.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar19 < local_268._M_string_length + local_1d8._M_string_length) {
        uVar19 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          uVar19 = local_1d8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar19 < local_268._M_string_length + local_1d8._M_string_length)
        goto LAB_00407942;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_1d8,0,(char *)0x0,(ulong)local_268._M_dataplus._M_p);
      }
      else {
LAB_00407942:
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_268,(ulong)local_1d8._M_dataplus._M_p);
      }
      pp_Var1 = (_Base_ptr *)(puVar11 + 2);
      if ((_Base_ptr *)*puVar11 == pp_Var1) {
        local_198 = *pp_Var1;
        p_Stack_190 = (_Base_ptr)puVar11[3];
        local_1a8._0_8_ = &local_198;
      }
      else {
        local_198 = *pp_Var1;
        local_1a8._0_8_ = (_Base_ptr *)*puVar11;
      }
      local_1a8._8_8_ = puVar11[1];
      *puVar11 = pp_Var1;
      puVar11[1] = 0;
      *(undefined1 *)pp_Var1 = 0;
      std::__cxx11::string::_M_append((char *)&local_290,local_1a8._0_8_);
      if ((_Base_ptr *)local_1a8._0_8_ != &local_198) {
        operator_delete((void *)local_1a8._0_8_,(ulong)((long)&local_198->_M_color + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_replace
                ((ulong)&local_248,0,(char *)local_248._M_string_length,0x55426b);
      pVar23 = std::
               _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
               ::_M_insert_unique<cmGeneratorTarget*const&>
                         ((_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
                           *)&(this->super_cmExportFileGenerator).ExportedTargets,&local_220->Target
                         );
      if (((undefined1  [16])pVar23 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"install(EXPORT \"",0x10);
        pcVar2 = local_270->IEGen->ExportSet;
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(pcVar2->Name)._M_dataplus._M_p,
                             (pcVar2->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\" ...) ",7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"includes target \"",0x11);
        psVar14 = cmGeneratorTarget::GetName_abi_cxx11_(local_220->Target);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,(psVar14->_M_dataplus)._M_p,psVar14->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13,"\" more than once in the export set.",0x23);
        std::__cxx11::stringbuf::str();
        cmSystemTools::Error(&local_268);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,
                          CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                   local_248.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p,
                          CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                   local_290.field_2._M_local_buf[0]) + 1);
        }
        bVar6 = false;
        goto LAB_004082c2;
      }
      if (iStack_210._M_current == local_208) {
        std::vector<cmTargetExport*,std::allocator<cmTargetExport*>>::
        _M_realloc_insert<cmTargetExport*const&>
                  ((vector<cmTargetExport*,std::allocator<cmTargetExport*>> *)&local_218,iStack_210,
                   &local_220);
      }
      else {
        *iStack_210._M_current = local_220;
        iStack_210._M_current = iStack_210._M_current + 1;
      }
      ppcVar18 = ppcVar18 + 1;
    } while (ppcVar18 != ppcVar3);
  }
  poVar13 = local_228;
  pcVar17 = local_270;
  (*(local_270->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xb])
            (local_270,local_228,&local_290);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                             local_248.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,
                    CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                             local_290.field_2._M_local_buf[0]) + 1);
  }
  (*(pcVar17->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x13])(pcVar17,poVar13);
  local_268._M_dataplus._M_p = (pointer)0x0;
  local_268._M_string_length = 0;
  local_268.field_2._M_allocated_capacity = 0;
  local_1b8 = iStack_210._M_current;
  if (local_218 == iStack_210._M_current) {
    uVar20 = 0;
  }
  else {
    local_1f8 = 0;
    local_1f0 = 0;
    local_1e8 = 0;
    ppcVar15 = local_218;
    uVar20 = 0;
    do {
      local_1dc = uVar20;
      paVar21 = &local_290.field_2;
      tei = *ppcVar15;
      this_00 = tei->Target;
      local_1b0 = ppcVar15;
      TVar8 = cmGeneratorTarget::GetType(this_00);
      pcVar17 = local_270;
      if (TVar8 == OBJECT_LIBRARY) {
        TVar8 = (uint)(tei->ObjectsGenerator == (cmInstallTargetGenerator *)0x0) * 3 +
                OBJECT_LIBRARY;
      }
      (*(local_270->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[6])
                (local_270,local_228,this_00);
      local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffff00000000;
      local_198 = (_Base_ptr)0x0;
      p_Stack_190 = (_Base_ptr)(local_1a8 + 8);
      local_180 = 0;
      local_1e0 = TVar8;
      local_188 = p_Stack_190;
      cmExportFileGenerator::PopulateIncludeDirectoriesInterface
                (&pcVar17->super_cmExportFileGenerator,tei,InstallInterface,
                 (ImportPropertyMap *)local_1a8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_268);
      cmExportFileGenerator::PopulateSourcesInterface
                (&pcVar17->super_cmExportFileGenerator,tei,InstallInterface,
                 (ImportPropertyMap *)local_1a8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_268);
      local_290._M_dataplus._M_p = (pointer)paVar21;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_290,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES","");
      pcVar17 = local_270;
      cmExportFileGenerator::PopulateInterfaceProperty
                (&local_270->super_cmExportFileGenerator,&local_290,this_00,InstallInterface,
                 (ImportPropertyMap *)local_1a8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_268);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != paVar21) {
        operator_delete(local_290._M_dataplus._M_p,
                        CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                 local_290.field_2._M_local_buf[0]) + 1);
      }
      local_290._M_dataplus._M_p = (pointer)paVar21;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_290,"INTERFACE_COMPILE_DEFINITIONS","");
      cmExportFileGenerator::PopulateInterfaceProperty
                (&pcVar17->super_cmExportFileGenerator,&local_290,this_00,InstallInterface,
                 (ImportPropertyMap *)local_1a8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_268);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != paVar21) {
        operator_delete(local_290._M_dataplus._M_p,
                        CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                 local_290.field_2._M_local_buf[0]) + 1);
      }
      local_290._M_dataplus._M_p = (pointer)paVar21;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_290,"INTERFACE_COMPILE_OPTIONS","");
      cmExportFileGenerator::PopulateInterfaceProperty
                (&pcVar17->super_cmExportFileGenerator,&local_290,this_00,InstallInterface,
                 (ImportPropertyMap *)local_1a8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_268);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != paVar21) {
        operator_delete(local_290._M_dataplus._M_p,
                        CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                 local_290.field_2._M_local_buf[0]) + 1);
      }
      local_290._M_dataplus._M_p = (pointer)paVar21;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_290,"INTERFACE_AUTOUIC_OPTIONS","");
      cmExportFileGenerator::PopulateInterfaceProperty
                (&pcVar17->super_cmExportFileGenerator,&local_290,this_00,InstallInterface,
                 (ImportPropertyMap *)local_1a8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_268);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != paVar21) {
        operator_delete(local_290._M_dataplus._M_p,
                        CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                 local_290.field_2._M_local_buf[0]) + 1);
      }
      local_290._M_dataplus._M_p = (pointer)paVar21;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_290,"INTERFACE_COMPILE_FEATURES","");
      cmExportFileGenerator::PopulateInterfaceProperty
                (&pcVar17->super_cmExportFileGenerator,&local_290,this_00,InstallInterface,
                 (ImportPropertyMap *)local_1a8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_268);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != paVar21) {
        operator_delete(local_290._M_dataplus._M_p,
                        CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                 local_290.field_2._M_local_buf[0]) + 1);
      }
      local_290._M_dataplus._M_p = (pointer)paVar21;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_290,"INTERFACE_LINK_OPTIONS","");
      cmExportFileGenerator::PopulateInterfaceProperty
                (&pcVar17->super_cmExportFileGenerator,&local_290,this_00,InstallInterface,
                 (ImportPropertyMap *)local_1a8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_268);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != paVar21) {
        operator_delete(local_290._M_dataplus._M_p,
                        CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                 local_290.field_2._M_local_buf[0]) + 1);
      }
      cmExportFileGenerator::PopulateLinkDirectoriesInterface
                (&pcVar17->super_cmExportFileGenerator,tei,InstallInterface,
                 (ImportPropertyMap *)local_1a8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_268);
      cmExportFileGenerator::PopulateLinkDependsInterface
                (&pcVar17->super_cmExportFileGenerator,tei,InstallInterface,
                 (ImportPropertyMap *)local_1a8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_268);
      local_290._M_string_length = 0;
      local_290.field_2._M_local_buf[0] = '\0';
      local_290._M_dataplus._M_p = (pointer)paVar21;
      bVar6 = cmExportFileGenerator::PopulateExportProperties
                        (&pcVar17->super_cmExportFileGenerator,this_00,
                         (ImportPropertyMap *)local_1a8,&local_290);
      if (bVar6) {
        PVar9 = cmPolicies::PolicyMap::Get(&this_00->PolicyMap,CMP0022);
        TVar5 = local_1e0;
        pcVar17 = local_270;
        if (((PVar9 != WARN) &&
            (PVar9 = cmPolicies::PolicyMap::Get(&this_00->PolicyMap,CMP0022), PVar9 != OLD)) &&
           (bVar7 = cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty
                              (&pcVar17->super_cmExportFileGenerator,this_00,InstallInterface,
                               (ImportPropertyMap *)local_1a8,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_268), bVar7)) {
          local_1f8 = CONCAT71((int7)((ulong)local_1f8 >> 8),
                               (byte)local_1f8 |
                               (pcVar17->super_cmExportFileGenerator).ExportOld ^ 1U);
        }
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"INTERFACE_SOURCES","")
        ;
        pcVar12 = cmGeneratorTarget::GetProperty(this_00,&local_248);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,
                          CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                   local_248.field_2._M_local_buf[0]) + 1);
        }
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_248,"INTERFACE_POSITION_INDEPENDENT_CODE","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&pcVar17->super_cmExportFileGenerator,&local_248,this_00,
                   (ImportPropertyMap *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,
                          CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                   local_248.field_2._M_local_buf[0]) + 1);
        }
        cmExportFileGenerator::PopulateCompatibleInterfaceProperties
                  (&pcVar17->super_cmExportFileGenerator,this_00,(ImportPropertyMap *)local_1a8);
        (*(pcVar17->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xf])
                  (pcVar17,this_00,local_228,local_1a8);
        local_1f0 = CONCAT71((int7)(local_1f0 >> 8),(byte)local_1f0 | TVar5 == INTERFACE_LIBRARY);
        local_1e8 = CONCAT71((int7)(local_1e8 >> 8),(byte)local_1e8 | pcVar12 != (char *)0x0);
      }
      else {
        cmSystemTools::Error(&local_290);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,
                        CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                 local_290.field_2._M_local_buf[0]) + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_1a8);
      poVar13 = local_228;
      pcVar17 = local_270;
      if (!bVar6) {
        bVar6 = false;
        goto LAB_004082b8;
      }
      uVar20 = CONCAT31((int3)(local_1dc >> 8),(byte)local_1dc | TVar8 != INTERFACE_LIBRARY);
      ppcVar15 = local_1b0 + 1;
    } while (ppcVar15 != local_1b8);
    if ((((byte)local_1e8 | (byte)local_1f0 | (byte)local_1f8) & 1) != 0) {
      pcVar12 = "2.8.12";
      if ((local_1f0 & 1) != 0) {
        pcVar12 = "3.0.0";
      }
      pcVar16 = "3.1.0";
      if ((local_1e8 & 1) == 0) {
        pcVar16 = pcVar12;
      }
      (*(local_270->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x10])
                (local_270,local_228,pcVar16);
    }
  }
  (*(pcVar17->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x14])(pcVar17,poVar13);
  (*(pcVar17->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x15])(pcVar17,poVar13);
  (*(pcVar17->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[9])(pcVar17,poVar13);
  bVar6 = true;
  if ((uVar20 & 1) != 0) {
    pbVar22 = (pcVar17->super_cmExportFileGenerator).Configurations.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar4 = (pcVar17->super_cmExportFileGenerator).Configurations.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar22 != pbVar4) {
      bVar6 = true;
      do {
        iVar10 = (*(local_270->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x16])
                           (local_270,pbVar22,&local_268);
        bVar6 = (bool)(bVar6 & (byte)iVar10);
        pbVar22 = pbVar22 + 1;
      } while (pbVar22 != pbVar4);
    }
  }
  (*(local_270->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[10])
            (local_270,local_228,&local_268);
LAB_004082b8:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_268);
LAB_004082c2:
  if (local_218 != (cmTargetExport **)0x0) {
    operator_delete(local_218,(long)local_208 - (long)local_218);
  }
  return bVar6;
}

Assistant:

bool cmExportInstallFileGenerator::GenerateMainFile(std::ostream& os)
{
  std::vector<cmTargetExport*> allTargets;
  {
    std::string expectedTargets;
    std::string sep;
    for (cmTargetExport* te :
         *this->IEGen->GetExportSet()->GetTargetExports()) {
      expectedTargets += sep + this->Namespace + te->Target->GetExportName();
      sep = " ";
      if (this->ExportedTargets.insert(te->Target).second) {
        allTargets.push_back(te);
      } else {
        std::ostringstream e;
        e << "install(EXPORT \"" << this->IEGen->GetExportSet()->GetName()
          << "\" ...) "
          << "includes target \"" << te->Target->GetName()
          << "\" more than once in the export set.";
        cmSystemTools::Error(e.str());
        return false;
      }
    }

    this->GenerateExpectedTargetsCode(os, expectedTargets);
  }

  // Compute the relative import prefix for the file
  this->GenerateImportPrefix(os);

  std::vector<std::string> missingTargets;

  bool require2_8_12 = false;
  bool require3_0_0 = false;
  bool require3_1_0 = false;
  bool requiresConfigFiles = false;
  // Create all the imported targets.
  for (cmTargetExport* te : allTargets) {
    cmGeneratorTarget* gt = te->Target;
    cmStateEnums::TargetType targetType = this->GetExportTargetType(te);

    requiresConfigFiles =
      requiresConfigFiles || targetType != cmStateEnums::INTERFACE_LIBRARY;

    this->GenerateImportTargetCode(os, gt, targetType);

    ImportPropertyMap properties;

    this->PopulateIncludeDirectoriesInterface(
      te, cmGeneratorExpression::InstallInterface, properties, missingTargets);
    this->PopulateSourcesInterface(te, cmGeneratorExpression::InstallInterface,
                                   properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_DEFINITIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_OPTIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_AUTOUIC_OPTIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_FEATURES", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_LINK_OPTIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);
    this->PopulateLinkDirectoriesInterface(
      te, cmGeneratorExpression::InstallInterface, properties, missingTargets);
    this->PopulateLinkDependsInterface(
      te, cmGeneratorExpression::InstallInterface, properties, missingTargets);

    std::string errorMessage;
    if (!this->PopulateExportProperties(gt, properties, errorMessage)) {
      cmSystemTools::Error(errorMessage);
      return false;
    }

    const bool newCMP0022Behavior =
      gt->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
      gt->GetPolicyStatusCMP0022() != cmPolicies::OLD;
    if (newCMP0022Behavior) {
      if (this->PopulateInterfaceLinkLibrariesProperty(
            gt, cmGeneratorExpression::InstallInterface, properties,
            missingTargets) &&
          !this->ExportOld) {
        require2_8_12 = true;
      }
    }
    if (targetType == cmStateEnums::INTERFACE_LIBRARY) {
      require3_0_0 = true;
    }
    if (gt->GetProperty("INTERFACE_SOURCES")) {
      // We can only generate INTERFACE_SOURCES in CMake 3.3, but CMake 3.1
      // can consume them.
      require3_1_0 = true;
    }

    this->PopulateInterfaceProperty("INTERFACE_POSITION_INDEPENDENT_CODE", gt,
                                    properties);

    this->PopulateCompatibleInterfaceProperties(gt, properties);

    this->GenerateInterfaceProperties(gt, os, properties);
  }

  if (require3_1_0) {
    this->GenerateRequiredCMakeVersion(os, "3.1.0");
  } else if (require3_0_0) {
    this->GenerateRequiredCMakeVersion(os, "3.0.0");
  } else if (require2_8_12) {
    this->GenerateRequiredCMakeVersion(os, "2.8.12");
  }

  this->LoadConfigFiles(os);

  this->CleanupTemporaryVariables(os);
  this->GenerateImportedFileCheckLoop(os);

  bool result = true;
  // Generate an import file for each configuration.
  // Don't do this if we only export INTERFACE_LIBRARY targets.
  if (requiresConfigFiles) {
    for (std::string const& c : this->Configurations) {
      if (!this->GenerateImportFileConfig(c, missingTargets)) {
        result = false;
      }
    }
  }

  this->GenerateMissingTargetsCheckCode(os, missingTargets);

  return result;
}